

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O2

void __thiscall
SmallDenseMap<VariableData_*,_UpvalueData_*,_VariableDataHasher,_2U>::insert
          (SmallDenseMap<VariableData_*,_UpvalueData_*,_VariableDataHasher,_2U> *this,
          VariableData **key,UpvalueData **value)

{
  Node *pNVar1;
  VariableData *pVVar2;
  VariableData *pVVar3;
  uint uVar4;
  uint uVar5;
  char *__assertion;
  int iVar6;
  
  pVVar3 = *key;
  if (pVVar3 == (VariableData *)0x0) {
    __assertion = "key != Key()";
    uVar4 = 0x3b;
  }
  else {
    uVar4 = this->bucketCount;
    if (uVar4 <= (this->count >> 2) + this->count) {
      rehash(this);
      uVar4 = this->bucketCount;
      pVVar3 = *key;
    }
    uVar5 = pVVar3->uniqueId;
    for (iVar6 = 1; iVar6 - uVar4 != 1; iVar6 = iVar6 + 1) {
      uVar5 = uVar5 & uVar4 - 1;
      pNVar1 = this->data + uVar5;
      pVVar2 = this->data[uVar5].key;
      if (pVVar2 == (VariableData *)0x0) {
        pNVar1->key = pVVar3;
        pNVar1->value = *value;
        this->count = this->count + 1;
        return;
      }
      if (pVVar2 == pVVar3) {
        pNVar1->value = *value;
        return;
      }
      uVar5 = uVar5 + iVar6;
    }
    __assertion = "!\"couldn\'t insert node\"";
    uVar4 = 0x5b;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/DenseMap.h"
                ,uVar4,
                "void SmallDenseMap<VariableData *, UpvalueData *, VariableDataHasher, 2>::insert(const Key &, const Value &) [Key = VariableData *, Value = UpvalueData *, Hasher = VariableDataHasher, N = 2]"
               );
}

Assistant:

void insert(const Key& key, const Value& value)
	{
		// Default value is used as an empty marker
		assert(key != Key());

		// Keep occupancy at <80%
		if(count + (count >> 2) >= bucketCount)
			rehash();

		unsigned bucketMask = bucketCount - 1;
		unsigned bucket = Hasher()(key) & bucketMask;

		for(unsigned i = 0; i < bucketCount; i++)
		{
			Node &item = data[bucket];

			if(item.key == Key())
			{
				item.key = key;
				item.value = value;

				count++;
				return;
			}

			if(item.key == key)
			{
				item.value = value;
				return;
			}

			// Quadratic probing
			bucket = (bucket + i + 1) & bucketMask;
		}

		assert(!"couldn't insert node");
	}